

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O3

void __thiscall
duckdb::PatasScanState<double>::ScanGroup<unsigned_long,true>
          (PatasScanState<double> *this,unsigned_long *values,idx_t group_size)

{
  idx_t iVar1;
  ulong uVar2;
  
  uVar2 = this->total_value_count;
  if (((uVar2 & 0x3ff) == 0) && (uVar2 < this->count)) {
    if (group_size == 0x400) {
      LoadGroup<true>(this,values);
      iVar1 = this->total_value_count + 0x400;
      goto LAB_0172da0c;
    }
    LoadGroup<false>(this,(this->group_state).values);
    uVar2 = this->total_value_count;
  }
  (this->group_state).index = (this->group_state).index + group_size;
  iVar1 = uVar2 + group_size;
LAB_0172da0c:
  this->total_value_count = iVar1;
  return;
}

Assistant:

void ScanGroup(EXACT_TYPE *values, idx_t group_size) {
		D_ASSERT(group_size <= PatasPrimitives::PATAS_GROUP_SIZE);
		D_ASSERT(group_size <= LeftInGroup());

		if (GroupFinished() && total_value_count < count) {
			if (group_size == PatasPrimitives::PATAS_GROUP_SIZE) {
				LoadGroup<SKIP>(values);
				total_value_count += group_size;
				return;
			} else {
				// Even if SKIP is given, group size is not big enough to be able to fully skip the entire group
				LoadGroup<false>(group_state.values);
			}
		}
		group_state.template Scan<SKIP>((uint8_t *)values, group_size);

		total_value_count += group_size;
	}